

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::XmlReporter::StartSection(XmlReporter *this,string *sectionName,string *description)

{
  int iVar1;
  XmlWriter *pXVar2;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + 1;
  if (0 < iVar1) {
    std::__cxx11::string::string((string *)&local_40,"Section",&local_a1);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_40);
    std::__cxx11::string::string((string *)&local_60,"name",&local_a2);
    trim(&local_80,sectionName);
    pXVar2 = XmlWriter::writeAttribute(pXVar2,&local_60,&local_80);
    std::__cxx11::string::string((string *)&local_a0,"description",&local_a3);
    XmlWriter::writeAttribute(pXVar2,&local_a0,description);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

virtual void StartSection( const std::string& sectionName, const std::string& description ) {
            if( m_sectionDepth++ > 0 ) {
                m_xml.startElement( "Section" )
                    .writeAttribute( "name", trim( sectionName ) )
                    .writeAttribute( "description", description );
            }
        }